

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBoolReader.cpp
# Opt level: O3

void IBoolReader::getBlock(ifstream *ifs,string *str,string *blockName,bool type)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  cVar4 = (char)str;
  if (blockName->_M_string_length != 0) {
    uVar5 = 0;
    do {
      std::istream::get();
      std::__cxx11::string::push_back(cVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < blockName->_M_string_length);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  puVar1 = local_50;
  if (local_48 == blockName->_M_string_length) {
    if (local_48 == 0) {
      bVar6 = false;
    }
    else {
      iVar3 = bcmp(local_50,(blockName->_M_dataplus)._M_p,local_48);
      bVar6 = iVar3 != 0;
    }
  }
  else {
    bVar6 = true;
  }
  if (puVar1 != local_40) {
    operator_delete(puVar1);
  }
  if (bVar6) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)&local_50);
    if (local_50 == local_40) {
      return;
    }
  }
  else {
    while (cVar2 = std::istream::get(), cVar2 != -1) {
      std::__cxx11::string::push_back(cVar4);
      bVar6 = IDictionary::isBlankSep(cVar2);
      if (!bVar6) {
        if (!type) goto LAB_0010ac45;
        if (cVar2 == '(') goto LAB_0010abe5;
        goto LAB_0010ab94;
      }
      if (cVar2 == '\n') {
        std::__cxx11::string::push_back(cVar4);
      }
    }
    if (!type) goto LAB_0010ac45;
LAB_0010ab94:
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)&local_50);
    if (local_50 == local_40) {
      return;
    }
  }
  operator_delete(local_50);
  return;
  while (std::__cxx11::string::push_back(cVar4), iVar3 << 0x18 != 0x29000000) {
LAB_0010abe5:
    iVar3 = std::istream::get();
    if (iVar3 << 0x18 == -0x1000000) break;
  }
  while( true ) {
    cVar2 = std::istream::get();
    bVar6 = IDictionary::isBlankSep(cVar2);
    if (!bVar6) break;
    std::__cxx11::string::push_back(cVar4);
    if (cVar2 == '\n') {
      std::__cxx11::string::push_back(cVar4);
    }
  }
LAB_0010ac45:
  if (cVar2 == ';') {
    std::__cxx11::string::push_back(cVar4);
  }
  else if (cVar2 == '{') {
    if (type) {
      std::__cxx11::string::push_back(cVar4);
    }
    iVar3 = std::istream::get();
    do {
      iVar3 = iVar3 << 0x18;
      if (iVar3 == -0x1000000) {
        return;
      }
      std::__cxx11::string::push_back(cVar4);
      if (iVar3 == 0x7d000000) {
        bVar6 = false;
      }
      else {
        bVar6 = true;
        if (iVar3 == 0xa000000) {
          std::__cxx11::string::push_back(cVar4);
        }
      }
      iVar3 = std::istream::get();
    } while (bVar6);
  }
  else {
    do {
      std::__cxx11::string::push_back(cVar4);
      cVar2 = std::istream::get();
    } while (cVar2 != ';');
  }
  return;
}

Assistant:

void IBoolReader::getBlock(std::ifstream* ifs,std::string &str, const std::string &blockName, bool type) {
    char tempChar;
    int num_3l;
    int base_len = str.length();

    for(int i=0;i<blockName.length();i++)
    {
        tempChar=ifs->get();
        str+=tempChar;
    }
    if(str.substr(str.length()-blockName.length(),blockName.length())!=blockName) {
        str = str.substr(0,base_len);
        return;
    }

    while((tempChar=ifs->get())!=EOF)
    {
        str+=tempChar;
        if(!IDictionary::isBlankSep(tempChar))
            break;
        if(tempChar=='\n')
            str+='\n';
    }

    if(type)
    {
        if (tempChar != '(') {
            str = str.substr(0, base_len);
            return;
        }
        while ((tempChar = ifs->get()) != EOF) {
            str += tempChar;
            if (tempChar == ')')
                break;
        }
        while (true) {
            tempChar = ifs->get();
            if (IDictionary::isBlankSep(tempChar)) {
                str += tempChar;
                if (tempChar == '\n')
                    str += '\n';
            } else
                break;
        }
    }

    if(tempChar=='{')
    {
        if(type)
            str+=tempChar;
        num_3l=1;

        while ((tempChar=ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=ifs->get();
        }while (tempChar!=';');
    }
}